

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_api.c
# Opt level: O2

MPP_RET avs2d_deinit(void *decoder)

{
  undefined8 *puVar1;
  MPP_RET MVar2;
  
  if (decoder == (void *)0x0) {
    MVar2 = MPP_ERR_INIT;
    if ((avs2d_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avs2d_api","input empty(%d).\n",(char *)0x0,0x31);
    }
  }
  else {
    if ((avs2d_parse_debug & 8) != 0) {
      _mpp_log_l(4,"avs2d_api","In.","avs2d_deinit");
    }
    puVar1 = *(undefined8 **)((long)decoder + 0x20);
    if ((void *)*puVar1 != (void *)0x0) {
      mpp_osal_free("avs2d_deinit",(void *)*puVar1);
      puVar1 = *(undefined8 **)((long)decoder + 0x20);
    }
    *puVar1 = 0;
    puVar1 = *(undefined8 **)((long)decoder + 0x28);
    if ((void *)*puVar1 != (void *)0x0) {
      mpp_osal_free("avs2d_deinit",(void *)*puVar1);
      puVar1 = *(undefined8 **)((long)decoder + 0x28);
    }
    *puVar1 = 0;
    if (*(void **)((long)decoder + 0x18) != (void *)0x0) {
      mpp_osal_free("avs2d_deinit",*(void **)((long)decoder + 0x18));
    }
    *(undefined8 *)((long)decoder + 0x18) = 0;
    if (*(void **)((long)decoder + 0x70) != (void *)0x0) {
      mpp_osal_free("avs2d_deinit",*(void **)((long)decoder + 0x70));
    }
    *(undefined8 *)((long)decoder + 0x70) = 0;
    mpp_packet_deinit((MppPacket *)((long)decoder + 0x10));
    avs2d_dpb_destroy((Avs2dCtx_t *)decoder);
    MVar2 = MPP_OK;
  }
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","Out.","avs2d_deinit");
  }
  return MVar2;
}

Assistant:

MPP_RET avs2d_deinit(void *decoder)
{
    MPP_RET ret = MPP_OK;
    Avs2dCtx_t *p_dec = (Avs2dCtx_t *)decoder;

    INP_CHECK(ret, !decoder);
    AVS2D_PARSE_TRACE("In.");

    MPP_FREE(p_dec->p_stream->pbuf);
    MPP_FREE(p_dec->p_header->pbuf);
    MPP_FREE(p_dec->mem);
    MPP_FREE(p_dec->p_nals);
    mpp_packet_deinit(&p_dec->task_pkt);
    avs2d_dpb_destroy(p_dec);

__RETURN:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}